

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

shared_ptr<LNode> __thiscall LParser::reduce_44(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar1;
  shared_ptr<LNode> local_60;
  LNodeRStmt local_50;
  undefined1 local_3c [12];
  shared_ptr<LNodeData<LNodeRStmt>_> r;
  shared_ptr<LNode> vars;
  LParser *this_local;
  
  this_00 = &r.super___shared_ptr<LNodeData<LNodeRStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  get_node((LParser *)this_00,in_ESI);
  local_3c._0_4_ = 0x34;
  std::shared_ptr<LNode>::shared_ptr(&local_60,(shared_ptr<LNode> *)this_00);
  LNodeRStmt::LNodeRStmt(&local_50,&local_60);
  std::make_shared<LNodeData<LNodeRStmt>,LNodeType,LNodeRStmt>
            ((LNodeType *)(local_3c + 4),(LNodeRStmt *)local_3c);
  LNodeRStmt::~LNodeRStmt(&local_50);
  std::shared_ptr<LNode>::~shared_ptr(&local_60);
  std::shared_ptr<LNode>::shared_ptr<LNodeData<LNodeRStmt>,void>
            ((shared_ptr<LNode> *)this,(shared_ptr<LNodeData<LNodeRStmt>_> *)(local_3c + 4));
  std::shared_ptr<LNodeData<LNodeRStmt>_>::~shared_ptr
            ((shared_ptr<LNodeData<LNodeRStmt>_> *)(local_3c + 4));
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &r.super___shared_ptr<LNodeData<LNodeRStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_44() {
    // RStmt : RETURN Vars BR Brs
    auto vars = this->get_node(3);
    auto r = std::make_shared<LNodeData<LNodeRStmt>>(LNodeType::RStmt, LNodeRStmt(vars));
    return r;
}